

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraph.h
# Opt level: O0

void __thiscall dg::LLVMDependenceGraph::LLVMDependenceGraph(LLVMDependenceGraph *this,bool threads)

{
  byte bVar1;
  byte in_SIL;
  undefined8 *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  DependenceGraph<dg::LLVMNode>::DependenceGraph
            ((DependenceGraph<dg::LLVMNode> *)
             (CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff));
  *in_RDI = std::__cxx11::string::reserve;
  std::unique_ptr<dg::BBlock<dg::LLVMNode>,std::default_delete<dg::BBlock<dg::LLVMNode>>>::
  unique_ptr<std::default_delete<dg::BBlock<dg::LLVMNode>>,void>
            ((unique_ptr<dg::BBlock<dg::LLVMNode>,_std::default_delete<dg::BBlock<dg::LLVMNode>_>_>
              *)CONCAT17(bVar1,in_stack_fffffffffffffff0));
  in_RDI[0x1e] = 0;
  in_RDI[0x20] = 0;
  *(byte *)(in_RDI + 0x21) = bVar1 & 1;
  std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::set
            ((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *)
             0x19de10);
  in_RDI[0x28] = 0;
  in_RDI[0x29] = 0;
  return;
}

Assistant:

LLVMDependenceGraph(bool threads = false) : threads(threads) {}